

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O0

void lowbd_fwd_txfm2d_32x16_avx2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  int iVar1;
  int iVar2;
  int iVar3;
  byte in_CL;
  __m256i *buf;
  int i;
  int lr_flip;
  int ud_flip;
  transform_1d_avx2_conflict1 row_txfm;
  transform_1d_avx2_conflict1 col_txfm;
  int height;
  int width;
  int cos_bit_row;
  int cos_bit_col;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  __m256i buf1 [64];
  __m256i buf0 [32];
  int in_stack_fffffffffffff344;
  int in_stack_fffffffffffff348;
  int in_stack_fffffffffffff34c;
  undefined4 in_stack_fffffffffffff350;
  int in_stack_fffffffffffff354;
  int16_t *in_stack_fffffffffffff358;
  __m256i *out;
  int local_c9c;
  int local_c98;
  int local_c94;
  transform_1d_avx2_conflict1 local_c90;
  transform_1d_avx2_conflict1 local_c88;
  int size;
  longlong local_c60 [51];
  __m256i *in_stack_fffffffffffff538;
  __m256i *in_stack_fffffffffffff540;
  longlong local_460 [131];
  byte local_45;
  
  local_45 = in_CL;
  iVar1 = get_txw_idx('\n');
  iVar2 = get_txh_idx('\n');
  iVar3 = (int)av1_fwd_cos_bit_col[iVar1][iVar2];
  iVar1 = (int)av1_fwd_cos_bit_row[iVar1][iVar2];
  size = 0x20;
  iVar2 = 0x10;
  local_c88 = col_txfm16x16_arr[local_45];
  local_c90 = row_txfm16x32_arr[local_45];
  get_flip_cfg(local_45,&local_c94,&local_c98);
  for (local_c9c = 0; local_c9c < 2; local_c9c = local_c9c + 1) {
    if (local_c94 == 0) {
      load_buffer_16bit_to_16bit_avx2
                (in_stack_fffffffffffff358,in_stack_fffffffffffff354,
                 (__m256i *)CONCAT44(in_stack_fffffffffffff34c,in_stack_fffffffffffff348),
                 in_stack_fffffffffffff344);
    }
    else {
      load_buffer_16bit_to_16bit_flip_avx2
                (in_stack_fffffffffffff358,in_stack_fffffffffffff354,
                 (__m256i *)CONCAT44(in_stack_fffffffffffff34c,in_stack_fffffffffffff348),
                 in_stack_fffffffffffff344);
    }
    round_shift_16bit_w16_avx2((__m256i *)CONCAT44(iVar3,iVar1),size,iVar2);
    (*local_c88)((__m256i *)local_460,(__m256i *)local_460,(int8_t)iVar3);
    round_shift_16bit_w16_avx2((__m256i *)CONCAT44(iVar3,iVar1),size,iVar2);
    transpose_16bit_16x16_avx2(in_stack_fffffffffffff540,in_stack_fffffffffffff538);
  }
  if (local_c98 == 0) {
    out = (__m256i *)local_c60;
  }
  else {
    out = (__m256i *)local_460;
    flip_buf_avx2((__m256i *)local_c60,out,0x20);
  }
  (*local_c90)(out,out,(int8_t)iVar1);
  round_shift_16bit_w16_avx2((__m256i *)CONCAT44(iVar3,iVar1),size,iVar2);
  store_rect_buffer_16bit_to_32bit_w16_avx2
            (out,(int32_t *)CONCAT44(in_stack_fffffffffffff354,in_stack_fffffffffffff350),
             in_stack_fffffffffffff34c,in_stack_fffffffffffff348);
  return;
}

Assistant:

static void lowbd_fwd_txfm2d_32x16_avx2(const int16_t *input, int32_t *output,
                                        int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  __m256i buf0[32], buf1[64];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_32X16];
  const int txw_idx = get_txw_idx(TX_32X16);
  const int txh_idx = get_txh_idx(TX_32X16);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = 32;
  const int height = 16;
  const transform_1d_avx2 col_txfm = col_txfm16x16_arr[tx_type];
  const transform_1d_avx2 row_txfm = row_txfm16x32_arr[tx_type];

  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);

  for (int i = 0; i < 2; i++) {
    if (ud_flip) {
      load_buffer_16bit_to_16bit_flip_avx2(input + 16 * i, stride, buf0,
                                           height);
    } else {
      load_buffer_16bit_to_16bit_avx2(input + 16 * i, stride, buf0, height);
    }
    round_shift_16bit_w16_avx2(buf0, height, shift[0]);
    col_txfm(buf0, buf0, cos_bit_col);
    round_shift_16bit_w16_avx2(buf0, height, shift[1]);
    transpose_16bit_16x16_avx2(buf0, buf1 + 0 * width + 16 * i);
  }

  __m256i *buf;
  if (lr_flip) {
    buf = buf0;
    flip_buf_avx2(buf1, buf, width);
  } else {
    buf = buf1;
  }
  row_txfm(buf, buf, cos_bit_row);
  round_shift_16bit_w16_avx2(buf, width, shift[2]);
  store_rect_buffer_16bit_to_32bit_w16_avx2(buf, output, height, width);
}